

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

void fs_event_unlink_files(uv_timer_t *handle)

{
  int iVar1;
  uv_loop_t *loop;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  char *pcVar3;
  uint uVar4;
  uv_fs_t *req;
  long *plVar5;
  uv_fs_event_t *puVar6;
  uv_handle_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_448 [32];
  uv_fs_t uStack_428;
  uv_loop_t *puStack_268;
  long lStack_250;
  char *pcStack_248;
  uv_fs_t uStack_1f8;
  undefined8 local_30;
  long local_28;
  
  if (handle == (uv_timer_t *)0x0) {
LAB_00184192:
    uVar4 = 0;
    do {
      uStack_1f8.bufsml[3].len = 0x1841c1;
      snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-",(ulong)uVar4);
      uStack_1f8.bufsml[3].len = 0x1841c9;
      remove(fs_event_filename);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x10);
    return;
  }
  local_28 = (long)fs_event_removed;
  local_30 = 0x10;
  if (local_28 < 0x10) {
    uStack_1f8.bufsml[3].len = 0x18410d;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    uStack_1f8.bufsml[3].len = 0x184115;
    iVar1 = remove(fs_event_filename);
    local_28 = (long)iVar1;
    local_30 = 0;
    if (local_28 == 0) {
      if (0xe < fs_event_removed) {
        fs_event_removed = fs_event_removed + 1;
        return;
      }
      uStack_1f8.bufsml[3].len = 0x184167;
      fs_event_removed = fs_event_removed + 1;
      iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
      local_28 = (long)iVar1;
      local_30 = 0;
      if (local_28 == 0) {
        return;
      }
      uStack_1f8.bufsml[3].len = 0x184192;
      fs_event_unlink_files_cold_3();
      goto LAB_00184192;
    }
  }
  else {
    uStack_1f8.bufsml[3].len = 0x1841ea;
    fs_event_unlink_files_cold_1();
  }
  plVar5 = &local_28;
  uStack_1f8.bufsml[3].len = (size_t)create_dir;
  fs_event_unlink_files_cold_2();
  req = &uStack_1f8;
  puVar6 = (uv_fs_event_t *)0x0;
  iVar2 = 0x1ed;
  iVar1 = uv_fs_mkdir((uv_loop_t *)0x0,req,(char *)plVar5,0x1ed,(uv_fs_cb)0x0);
  if ((iVar1 == -0x11) || (iVar1 == 0)) {
    uv_fs_req_cleanup(&uStack_1f8);
    return;
  }
  create_dir_cold_1();
  uVar4 = fs_event_cb_called + 1;
  pcVar3 = (char *)(ulong)uVar4;
  fs_event_cb_called = uVar4;
  if (puVar6 == &fs_event) {
    if (iVar2 != 0) goto LAB_00184345;
    if (1 < extraout_EDX - 1U) goto LAB_00184352;
    iVar1 = strncmp((char *)req,"fsevent-",8);
    if (iVar1 == 0) {
      if (fs_event_removed + fs_event_created == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return;
        }
        fs_event_cb_dir_multi_file_cold_5();
      }
      if (uVar4 != 0x20) {
        return;
      }
      uv_close((uv_handle_t *)&timer,close_cb);
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_00184345:
    fs_event_cb_dir_multi_file_cold_2();
LAB_00184352:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar3 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_248 = pcVar3;
  loop = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(loop,&fs_event);
  lStack_250 = (long)iVar1;
  if (lStack_250 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    lStack_250 = (long)iVar1;
    if (lStack_250 != 0) goto LAB_00184634;
    iVar1 = uv_timer_init(loop,&timer);
    lStack_250 = (long)iVar1;
    if (lStack_250 != 0) goto LAB_00184641;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    lStack_250 = (long)iVar1;
    if (lStack_250 != 0) goto LAB_0018464e;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_250 = 1;
    if (fs_event_cb_called != 1) goto LAB_0018465b;
    lStack_250 = 2;
    if (timer_cb_called != 2) goto LAB_00184668;
    lStack_250 = 2;
    if (close_cb_called != 2) goto LAB_00184675;
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_250 = 0;
    iVar1 = uv_loop_close(loop);
    if (lStack_250 == iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_watch_file_cold_1();
LAB_00184634:
    run_test_fs_event_watch_file_cold_2();
LAB_00184641:
    run_test_fs_event_watch_file_cold_3();
LAB_0018464e:
    run_test_fs_event_watch_file_cold_4();
LAB_0018465b:
    run_test_fs_event_watch_file_cold_5();
LAB_00184668:
    run_test_fs_event_watch_file_cold_6();
LAB_00184675:
    run_test_fs_event_watch_file_cold_7();
  }
  plVar5 = &lStack_250;
  run_test_fs_event_watch_file_cold_8();
  iVar2 = 0x41;
  auStack_448._0_8_ = (void *)0x1846b5;
  puStack_268 = loop;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_448 + 0x20),(char *)plVar5,0x41,0x180,
                     (uv_fs_cb)0x0);
  auStack_448._24_8_ = SEXT48(iVar1);
  auStack_448._16_8_ = 0;
  if ((uv_close_cb)auStack_448._24_8_ == (uv_close_cb)0x0) {
    auStack_448._0_8_ = (void *)0x1846e1;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_448 + 0x20));
    iVar2 = 0;
    auStack_448._0_8_ = (void *)0x1846ef;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_448 + 0x20),
                        (uv_os_fd_t)uStack_428.result,(uv_fs_cb)0x0);
    auStack_448._24_8_ = SEXT48(iVar1);
    auStack_448._16_8_ = 0;
    if ((uv_close_cb)auStack_448._24_8_ == (uv_close_cb)0x0) {
      auStack_448._0_8_ = (void *)0x184715;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_448 + 0x20));
      return;
    }
  }
  else {
    auStack_448._0_8_ = (void *)0x18472e;
    create_file_cold_1();
  }
  puVar6 = (uv_fs_event_t *)(auStack_448 + 0x18);
  pcVar3 = auStack_448 + 0x10;
  auStack_448._0_8_ = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar6 == &fs_event) {
    auStack_448._0_8_ = SEXT48(iVar2);
    if ((code *)auStack_448._0_8_ != (code *)0x0) goto LAB_0018480b;
    auStack_448._0_8_ = SEXT48(extraout_EDX_00);
    if ((code *)auStack_448._0_8_ != (code *)0x2) goto LAB_0018481a;
    iVar1 = strcmp(pcVar3,"file2");
    auStack_448._0_8_ = SEXT48(iVar1);
    if ((code *)auStack_448._0_8_ == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      auStack_448._0_8_ = SEXT48(iVar1);
      if ((code *)auStack_448._0_8_ == (code *)0x0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return;
      }
      goto LAB_00184838;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_0018480b:
    fs_event_cb_file_cold_2();
LAB_0018481a:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00184838:
  handle_00 = (uv_handle_t *)auStack_448;
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close(handle_00,close_cb);
  return;
}

Assistant:

static void fs_event_unlink_files(uv_timer_t* handle) {
  int r;
  int i;

  /* NOTE: handle might be NULL if invoked not as timer callback */
  if (handle == NULL) {
    /* Unlink all files */
    for (i = 0; i < 16; i++) {
      r = remove(fs_event_get_filename(i));
      if (handle != NULL)
        ASSERT_OK(r);
    }
  } else {
    /* Make sure we're not attempting to remove files we do not intend */
    ASSERT_LT(fs_event_removed, fs_event_file_count);

    /* Remove the file */
    ASSERT_OK(remove(fs_event_get_filename(fs_event_removed)));

    if (++fs_event_removed < fs_event_file_count) {
      /* Remove another file on a different event loop tick.  We do it this way
       * to avoid fs events coalescing into one fs event. */
      ASSERT_OK(uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
    }
  }
}